

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void kj::_::Debug::
     log<char_const(&)[37],kj::_::DebugComparison<char,unsigned_char&>&,char,unsigned_char&>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [37],
               DebugComparison<char,_unsigned_char_&> *params_1,char *params_2,uchar *params_3)

{
  char cVar1;
  long lVar2;
  undefined8 uVar3;
  undefined4 in_register_00000014;
  uchar *params_00;
  long lVar4;
  String *result;
  ArrayPtr<kj::String> in_stack_ffffffffffffff58;
  undefined8 auStack_98 [4];
  String local_78;
  String local_60;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  str<char_const(&)[37]>
            ((String *)&stack0xffffffffffffff58,(kj *)params,
             (char (*) [37])CONCAT44(in_register_00000014,severity));
  _::operator*(&local_48,params_1);
  auStack_98[1] = local_48;
  auStack_98[2] = local_40;
  auStack_98[3] = uStack_38;
  cVar1 = *params_2;
  heapString(&local_78,1);
  if ((char *)local_78.content.size_ != (char *)0x0) {
    local_78.content.size_ = (size_t)local_78.content.ptr;
  }
  *(char *)local_78.content.size_ = cVar1;
  str<unsigned_char&>(&local_60,(kj *)params_3,params_00);
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              &stack0xffffffffffffff58,in_stack_ffffffffffffff58);
  lVar4 = 0x48;
  do {
    lVar2 = *(long *)(&stack0xffffffffffffff58 + lVar4);
    if (lVar2 != 0) {
      uVar3 = *(undefined8 *)(&stack0xffffffffffffff60 + lVar4);
      *(undefined8 *)(&stack0xffffffffffffff58 + lVar4) = 0;
      *(undefined8 *)(&stack0xffffffffffffff60 + lVar4) = 0;
      (**(code **)**(undefined8 **)((long)auStack_98 + lVar4))
                (*(undefined8 **)((long)auStack_98 + lVar4),lVar2,1,uVar3,uVar3,0);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}